

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

void unloadtags(void)

{
  ctag *pcVar1;
  ctag *nxt;
  ctag *var;
  
  nxt = tagtree_RB_MINMAX(&tags,-1);
  while (nxt != (ctag *)0x0) {
    pcVar1 = tagtree_RB_NEXT(nxt);
    tagtree_RB_REMOVE(&tags,nxt);
    free(nxt->tag);
    free(nxt);
    nxt = pcVar1;
  }
  return;
}

Assistant:

void
unloadtags(void)
{
	struct ctag *var, *nxt;

	for (var = RB_MIN(tagtree, &tags); var != NULL; var = nxt) {
		nxt = RB_NEXT(tagtree, &tags, var);
		RB_REMOVE(tagtree, &tags, var);
		/* line parsed with fparseln needs to be freed */
		free(var->tag);
		free(var);
	}
}